

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCopiesAndBlittingTests.cpp
# Opt level: O2

void __thiscall
vkt::api::anon_unknown_0::CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance
          (CopiesAndBlittingTestInstance *this,Context *context,TestParams *testParams)

{
  Move<vk::Handle<(vk::HandleType)24>_> *this_00;
  Move<vk::VkCommandBuffer_s_*> *pMVar1;
  deUint32 queueFamilyIndex;
  DeviceInterface *vk;
  VkDevice device;
  RefBase<vk::Handle<(vk::HandleType)24>_> local_88;
  VkCommandBuffer_s *local_68;
  DeviceInterface *pDStack_60;
  VkDevice local_58;
  VkAllocationCallbacks *pVStack_50;
  Move<vk::VkCommandBuffer_s_*> *local_40;
  TestParams *local_38;
  
  (this->super_TestInstance).m_context = context;
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__CopiesAndBlittingTestInstance_00bf8c10;
  local_38 = &this->m_params;
  TestParams::TestParams(local_38,testParams);
  (this->m_destinationTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  this_00 = &this->m_cmdPool;
  (this->m_expectedTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  local_40 = &this->m_cmdBuffer;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.object.m_internal = 0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.object =
       (VkCommandBuffer_s *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_device = (VkDevice)0x0
  ;
  (this->m_cmdBuffer).super_RefBase<vk::VkCommandBuffer_s_*>.m_data.deleter.m_pool.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = 0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device =
       (VkDevice)0x0;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  (this->m_sourceTextureLevel).
  super_UniqueBase<tcu::TextureLevel,_de::DefaultDeleter<tcu::TextureLevel>_>.m_data.ptr =
       (TextureLevel *)0x0;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_88,vk,device,2,queueFamilyIndex,
             (VkAllocationCallbacks *)0x0);
  local_58 = local_88.m_data.deleter.m_device;
  pVStack_50 = local_88.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)local_88.m_data.object.m_internal;
  pDStack_60 = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::reset
            (&this_00->super_RefBase<vk::Handle<(vk::HandleType)24>_>);
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_device =
       local_58;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_allocator =
       pVStack_50;
  (this_00->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal =
       (deUint64)local_68;
  (this->m_cmdPool).super_RefBase<vk::Handle<(vk::HandleType)24>_>.m_data.deleter.m_deviceIface =
       pDStack_60;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)24>_>::~RefBase(&local_88);
  ::vk::allocateCommandBuffer
            ((Move<vk::VkCommandBuffer_s_*> *)&local_88,vk,device,
             (VkCommandPool)
             (this_00->super_RefBase<vk::Handle<(vk::HandleType)24>_>).m_data.object.m_internal,
             VK_COMMAND_BUFFER_LEVEL_PRIMARY);
  pMVar1 = local_40;
  local_58 = local_88.m_data.deleter.m_device;
  pVStack_50 = local_88.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)local_88.m_data.object.m_internal;
  pDStack_60 = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::reset
            (&local_40->super_RefBase<vk::VkCommandBuffer_s_*>);
  (pMVar1->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_device = local_58;
  (pMVar1->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_pool.m_internal =
       (deUint64)pVStack_50;
  (pMVar1->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.object = local_68;
  (pMVar1->super_RefBase<vk::VkCommandBuffer_s_*>).m_data.deleter.m_deviceIface = pDStack_60;
  ::vk::refdetails::RefBase<vk::VkCommandBuffer_s_*>::~RefBase
            ((RefBase<vk::VkCommandBuffer_s_*> *)&local_88);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_88,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  local_58 = local_88.m_data.deleter.m_device;
  pVStack_50 = local_88.m_data.deleter.m_allocator;
  local_68 = (VkCommandBuffer_s *)local_88.m_data.object.m_internal;
  pDStack_60 = local_88.m_data.deleter.m_deviceIface;
  local_88.m_data.object.m_internal = 0;
  local_88.m_data.deleter.m_deviceIface = (DeviceInterface *)0x0;
  local_88.m_data.deleter.m_device = (VkDevice)0x0;
  local_88.m_data.deleter.m_allocator = (VkAllocationCallbacks *)0x0;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::reset
            (&(this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>);
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = local_58;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator =
       pVStack_50;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal =
       (deUint64)local_68;
  (this->m_fence).super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       pDStack_60;
  ::vk::refdetails::RefBase<vk::Handle<(vk::HandleType)6>_>::~RefBase
            ((RefBase<vk::Handle<(vk::HandleType)6>_> *)&local_88);
  return;
}

Assistant:

CopiesAndBlittingTestInstance::CopiesAndBlittingTestInstance (Context& context, TestParams testParams)
	: vkt::TestInstance	(context)
	, m_params			(testParams)
{
	const DeviceInterface&		vk					= context.getDeviceInterface();
	const VkDevice				vkDevice			= context.getDevice();
	const deUint32				queueFamilyIndex	= context.getUniversalQueueFamilyIndex();

	// Create command pool
	m_cmdPool = createCommandPool(vk, vkDevice, VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT, queueFamilyIndex);

	// Create command buffer
	m_cmdBuffer = allocateCommandBuffer(vk, vkDevice, *m_cmdPool, VK_COMMAND_BUFFER_LEVEL_PRIMARY);

	// Create fence
	m_fence = createFence(vk, vkDevice);
}